

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O3

void __thiscall
solitaire::events::EventsProcessorTests::acceptLeftButtonDownOnCoveredStockPileCards
          (EventsProcessorTests *this,MouseLeftButtonDown *event)

{
  FunctionMocker<solitaire::interfaces::Solitaire_&()> *this_00;
  bool bVar1;
  TypedExpectation<bool_(const_solitaire::geometry::Position_&)> *this_01;
  ActionInterface<bool_(const_solitaire::geometry::Position_&)> *impl;
  TypedExpectation<solitaire::interfaces::Solitaire_&()> *this_02;
  ActionInterface<solitaire::interfaces::Solitaire_&()> *impl_00;
  FunctionMocker<void_()> *this_03;
  undefined1 local_88 [16];
  VTable *local_78;
  bool *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  _Any_data local_58;
  code *local_48;
  MatcherBase<const_solitaire::geometry::Position_&> local_38;
  
  testing::Matcher<const_solitaire::geometry::Position_&>::Matcher
            ((Matcher<const_solitaire::geometry::Position_&> *)&local_38,&event->position);
  colliders::StockPileColliderMock::gmock_coveredCardsCollidesWith
            ((MockSpec<bool_(const_solitaire::geometry::Position_&)> *)local_88,
             &(this->stockPileColliderMock).super_StockPileColliderMock,
             (Matcher<const_solitaire::geometry::Position_&> *)&local_38);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<bool_(const_solitaire::geometry::Position_&)>::
            InternalExpectedAt((MockSpec<bool_(const_solitaire::geometry::Position_&)> *)local_88,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                               ,0x7b,"stockPileColliderMock",
                               "coveredCardsCollidesWith(event.position)");
  local_68 = (bool *)operator_new(1);
  *local_68 = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_60,local_68);
  impl = (ActionInterface<bool_(const_solitaire::geometry::Position_&)> *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00323800;
  bVar1 = *local_68;
  *(bool *)&impl[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&impl[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(const_solitaire::geometry::Position_&)>::Action
            ((Action<bool_(const_solitaire::geometry::Position_&)> *)&local_58,impl);
  testing::internal::TypedExpectation<bool_(const_solitaire::geometry::Position_&)>::WillOnce
            (this_01,(Action<bool_(const_solitaire::geometry::Position_&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  testing::internal::MatcherBase<const_solitaire::geometry::Position_&>::~MatcherBase
            ((MatcherBase<const_solitaire::geometry::Position_&> *)(local_88 + 8));
  testing::internal::MatcherBase<const_solitaire::geometry::Position_&>::~MatcherBase(&local_38);
  this_00 = &(this->contextMock).super_ContextMock.gmock00_getSolitaire_15;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,&this->contextMock);
  local_58._M_unused._0_8_ = (undefined8)this_00;
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<solitaire::interfaces::Solitaire_&()>::InternalExpectedAt
                      ((MockSpec<solitaire::interfaces::Solitaire_&()> *)&local_58,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x7d,"contextMock","getSolitaire()");
  impl_00 = (ActionInterface<solitaire::interfaces::Solitaire_&()> *)operator_new(0x10);
  impl_00->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_003238f0;
  impl_00[1]._vptr_ActionInterface = (_func_int **)&this->solitaireMock;
  testing::Action<solitaire::interfaces::Solitaire_&()>::Action
            ((Action<solitaire::interfaces::Solitaire_&()> *)local_88,impl_00);
  testing::internal::TypedExpectation<solitaire::interfaces::Solitaire_&()>::WillOnce
            (this_02,(Action<solitaire::interfaces::Solitaire_&()> *)local_88);
  if (local_78 != (VTable *)0x0) {
    (*(code *)local_78)(local_88,local_88,3);
  }
  this_03 = &(this->solitaireMock).super_SolitaireMock.gmock00_trySelectNextStockPileCard_24;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_03->super_UntypedFunctionMockerBase,&this->solitaireMock);
  local_88._0_8_ = this_03;
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            ((MockSpec<void_()> *)local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
             ,0x7e,"solitaireMock","trySelectNextStockPileCard()");
  return;
}

Assistant:

void acceptLeftButtonDownOnCoveredStockPileCards(const MouseLeftButtonDown& event) {
        EXPECT_CALL(stockPileColliderMock, coveredCardsCollidesWith(event.position))
            .WillOnce(Return(true));
        EXPECT_CALL(contextMock, getSolitaire()).WillOnce(ReturnRef(solitaireMock));
        EXPECT_CALL(solitaireMock, trySelectNextStockPileCard());
    }